

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS
ref_cavity_find_face_with_side
          (REF_CAVITY ref_cavity,REF_INT node0,REF_INT node1,REF_INT *found_face)

{
  int iVar1;
  int iVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  *found_face = -1;
  uVar9 = 0xffffffffffffffff;
  uVar6 = 8;
  uVar7 = 0;
  do {
    if ((long)ref_cavity->maxface <= (long)uVar7) {
LAB_001bbd74:
      return (REF_STATUS)uVar6;
    }
    pRVar3 = ref_cavity->f2n;
    iVar1 = *(int *)((long)pRVar3 + (uVar6 - 8));
    if (iVar1 != -1) {
      iVar2 = *(int *)((long)pRVar3 + (uVar6 - 4));
      if ((iVar1 != node0) || (iVar2 != node1)) {
        if ((*(int *)((long)pRVar3 + uVar6) != node1 || iVar2 != node0) &&
           (iVar1 != node1 || *(int *)((long)pRVar3 + uVar6) != node0)) goto LAB_001bbcf8;
      }
      if ((int)uVar9 != -1) {
        if (ref_cavity->debug != 0) {
          pRVar4 = ref_cavity->ref_grid->node->real;
          lVar8 = (long)(node0 * 0xf);
          printf("at node0 %f %f %f\n",pRVar4[lVar8],pRVar4[lVar8 + 1],pRVar4[lVar8 + 2]);
          pRVar4 = ref_cavity->ref_grid->node->real;
          lVar8 = (long)(node1 * 0xf);
          uVar5 = printf("at node1 %f %f %f\n",pRVar4[lVar8],pRVar4[lVar8 + 1],pRVar4[lVar8 + 2]);
          uVar6 = (ulong)uVar5;
        }
        ref_cavity->state = REF_CAVITY_INCONSISTENT;
        *found_face = -1;
        goto LAB_001bbd74;
      }
      *found_face = (REF_INT)uVar7;
      uVar9 = uVar7 & 0xffffffff;
    }
LAB_001bbcf8:
    uVar7 = uVar7 + 1;
    uVar6 = uVar6 + 0xc;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_find_face_with_side(REF_CAVITY ref_cavity,
                                                         REF_INT node0,
                                                         REF_INT node1,
                                                         REF_INT *found_face) {
  REF_INT face;

  *found_face = REF_EMPTY;

  each_ref_cavity_valid_face(ref_cavity, face) {
    if ((node0 == ref_cavity_f2n(ref_cavity, 0, face) &&
         node1 == ref_cavity_f2n(ref_cavity, 1, face)) ||
        (node0 == ref_cavity_f2n(ref_cavity, 1, face) &&
         node1 == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (node0 == ref_cavity_f2n(ref_cavity, 2, face) &&
         node1 == ref_cavity_f2n(ref_cavity, 0, face))) {
      if (REF_EMPTY != *found_face) { /* found face twice */
        if (ref_cavity_debug(ref_cavity)) {
          printf("at node0 %f %f %f\n",
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                              node0),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                              node0),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                              node0));
          printf("at node1 %f %f %f\n",
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                              node1),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                              node1),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                              node1));
        }
        ref_cavity_state(ref_cavity) = REF_CAVITY_INCONSISTENT;
        *found_face = REF_EMPTY;
        return REF_SUCCESS;
      }
      *found_face = face;
    }
  }

  return REF_SUCCESS;
}